

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O1

uint64_t color_cell_compression
                   (uint32_t mode,color_cell_compressor_params *pParams,
                   color_cell_compressor_results *pResults,
                   bc7enc_compress_block_params *pComp_params)

{
  ushort uVar1;
  uint32_t uVar2;
  color_quad_u8 *pcVar3;
  bool bVar4;
  undefined1 auVar5 [13];
  int iVar6;
  int iVar7;
  uint64_t uVar8;
  uint uVar9;
  char cVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t unaff_RBP;
  uint uVar13;
  uint uVar14;
  int iVar15;
  color_quad_u8 *pcVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  byte bVar24;
  float fVar20;
  float fVar25;
  undefined8 uVar21;
  undefined4 uVar26;
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined8 uVar29;
  undefined4 uVar32;
  undefined1 auVar30 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float b;
  float d;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  uint uVar44;
  float fVar45;
  uint uVar46;
  float fVar47;
  uint uVar48;
  float fVar49;
  vec4F xl;
  vec4F xl_00;
  vec4F xl_01;
  vec4F xl_02;
  vec4F xl_03;
  vec4F xl_04;
  vec4F xh;
  vec4F xh_00;
  vec4F xh_01;
  vec4F xh_02;
  vec4F xh_03;
  vec4F xh_04;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  vec4F local_108;
  vec4F local_f8;
  uint8_t selectors_temp1 [16];
  uint8_t selectors_temp [16];
  uint32_t local_a8 [2];
  uint8_t *puStack_a0;
  uint8_t *local_98;
  undefined1 auVar23 [16];
  undefined1 auVar31 [16];
  
  pResults->m_best_overall_err = 0xffffffffffffffff;
  if (mode == 1) {
    pcVar3 = pParams->m_pPixels;
    bVar24 = pcVar3->m_c[0];
    uVar48 = pParams->m_num_pixels;
    bVar17 = uVar48 >= 2;
    if (uVar48 < 2) {
LAB_001066af:
      unaff_RBP = pack_mode1_to_one_color
                            (pParams,pResults,(uint)bVar24,(uint)pcVar3->m_c[1],(uint)pcVar3->m_c[2]
                             ,pResults->m_pSelectors);
    }
    else if (bVar24 == pcVar3[1].m_c[0]) {
      pcVar16 = pcVar3 + 1;
      uVar14 = 2;
      do {
        if ((pcVar3->m_c[1] != pcVar16->m_c[1]) || (pcVar3->m_c[2] != pcVar16->m_c[2])) break;
        bVar17 = uVar14 < uVar48;
        if (uVar14 == uVar48) goto LAB_001066af;
        pcVar16 = pcVar3 + uVar14;
        uVar14 = uVar14 + 1;
      } while (bVar24 == pcVar16->m_c[0]);
    }
LAB_001066df:
    if (!bVar17) {
      return unaff_RBP;
    }
  }
  else if (mode == 7) {
    pcVar3 = pParams->m_pPixels;
    bVar24 = pcVar3->m_c[0];
    uVar48 = pParams->m_num_pixels;
    bVar17 = uVar48 >= 2;
    if (uVar48 < 2) {
LAB_001066c2:
      unaff_RBP = pack_mode7_to_one_color
                            (pParams,pResults,(uint)bVar24,(uint)pcVar3->m_c[1],(uint)pcVar3->m_c[2]
                             ,(uint)pcVar3->m_c[3],pResults->m_pSelectors,uVar48,pcVar3);
    }
    else if (bVar24 == pcVar3[1].m_c[0]) {
      pcVar16 = pcVar3 + 1;
      uVar14 = 2;
      do {
        if (((pcVar3->m_c[1] != pcVar16->m_c[1]) || (pcVar3->m_c[2] != pcVar16->m_c[2])) ||
           (pcVar3->m_c[3] != pcVar16->m_c[3])) break;
        bVar17 = uVar14 < uVar48;
        if (uVar14 == uVar48) goto LAB_001066c2;
        pcVar16 = pcVar3 + uVar14;
        uVar14 = uVar14 + 1;
      } while (bVar24 == pcVar16->m_c[0]);
    }
    goto LAB_001066df;
  }
  uVar12 = (ulong)pParams->m_num_pixels;
  if (uVar12 == 0) {
    fVar39 = 0.0;
    fVar40 = 0.0;
    fVar19 = 0.0;
    fVar25 = 0.0;
  }
  else {
    uVar11 = 0;
    fVar19 = 0.0;
    fVar25 = 0.0;
    fVar39 = 0.0;
    fVar40 = 0.0;
    do {
      uVar1 = *(ushort *)pParams->m_pPixels[uVar11].m_c;
      fVar39 = fVar39 + (float)(uVar1 & 0xff);
      fVar40 = fVar40 + (float)(byte)(uVar1 >> 8);
      uVar1 = *(ushort *)(pParams->m_pPixels[uVar11].m_c + 2);
      fVar19 = fVar19 + (float)(uVar1 & 0xff);
      fVar25 = fVar25 + (float)(byte)(uVar1 >> 8);
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  fVar33 = 1.0 / ((float)uVar12 * 255.0);
  fVar28 = fVar39 * fVar33;
  fVar38 = fVar40 * fVar33;
  local_110 = 0.0;
  local_114 = 0.0;
  if ((0.0 <= fVar28) && (local_114 = fVar28, 1.0 < fVar28)) {
    local_114 = 1.0;
  }
  fVar28 = fVar19 * fVar33;
  if ((0.0 <= fVar38) && (local_110 = fVar38, 1.0 < fVar38)) {
    local_110 = 1.0;
  }
  fVar38 = 1.0 / (float)uVar12;
  fVar33 = fVar25 * fVar33;
  local_10c = 0.0;
  local_118 = 0.0;
  if ((0.0 <= fVar28) && (local_118 = fVar28, 1.0 < fVar28)) {
    local_118 = 1.0;
  }
  if ((0.0 <= fVar33) && (local_10c = fVar33, 1.0 < fVar33)) {
    local_10c = 1.0;
  }
  fVar39 = fVar39 * fVar38;
  fVar40 = fVar40 * fVar38;
  fVar19 = fVar19 * fVar38;
  if (pParams->m_has_alpha == '\0') {
    if (uVar12 == 0) {
      fVar33 = 0.0;
      fVar20 = 0.0;
      fVar34 = 0.0;
      fVar28 = 0.0;
      fVar41 = 0.0;
      fVar42 = 0.0;
    }
    else {
      fVar28 = 0.0;
      uVar11 = 0;
      fVar34 = 0.0;
      fVar33 = 0.0;
      fVar20 = 0.0;
      fVar41 = 0.0;
      fVar42 = 0.0;
      do {
        fVar35 = (float)pParams->m_pPixels[uVar11].m_c[0] - fVar39;
        uVar1 = *(ushort *)(pParams->m_pPixels[uVar11].m_c + 1);
        fVar36 = (float)(uVar1 & 0xff) - fVar40;
        fVar37 = (float)(byte)(uVar1 >> 8) - fVar19;
        fVar28 = fVar28 + fVar35 * fVar35;
        fVar41 = fVar41 + fVar35 * fVar36;
        fVar42 = fVar42 + fVar35 * fVar37;
        fVar34 = fVar34 + fVar36 * fVar36;
        fVar33 = fVar33 + fVar37 * fVar36;
        fVar20 = fVar20 + fVar37 * fVar37;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    fVar36 = 1.0;
    fVar37 = 0.7;
    iVar6 = 3;
    fVar35 = 0.9;
    do {
      fVar45 = fVar37 * fVar42 + fVar35 * fVar28 + fVar41 * fVar36;
      fVar43 = fVar37 * fVar33 + fVar35 * fVar41 + fVar36 * fVar34;
      fVar37 = fVar37 * fVar20 + fVar35 * fVar42 + fVar36 * fVar33;
      fVar35 = ABS(fVar45);
      if (ABS(fVar45) <= ABS(fVar43)) {
        fVar35 = ABS(fVar43);
      }
      if (fVar35 <= ABS(fVar37)) {
        fVar35 = ABS(fVar37);
      }
      fVar47 = 1.0 / fVar35;
      if (1e-10 < fVar35) {
        fVar45 = fVar45 * fVar47;
      }
      uVar48 = (int)((uint)(1e-10 < fVar35) << 0x1f) >> 0x1f;
      uVar14 = (int)((uint)(1e-10 < fVar35) << 0x1f) >> 0x1f;
      fVar36 = (float)(~uVar48 & (uint)fVar43 | (uint)(fVar47 * fVar43) & uVar48);
      fVar37 = (float)(~uVar14 & (uint)fVar37 | (uint)(fVar47 * fVar37) & uVar14);
      iVar6 = iVar6 + -1;
      fVar35 = fVar45;
    } while (iVar6 != 0);
    fVar20 = fVar37 * fVar37 + fVar45 * fVar45 + fVar36 * fVar36;
    fVar41 = 0.0;
    fVar42 = 0.0;
    fVar28 = 0.0;
    fVar33 = 0.0;
    if (1e-10 <= fVar20) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar20 = 1.0 / fVar20;
      fVar41 = fVar45 * fVar20;
      fVar42 = fVar36 * fVar20;
      fVar28 = fVar37 * fVar20;
      fVar33 = 0.0;
    }
  }
  else {
    if (pParams->m_num_pixels == 0) {
      fVar41 = 0.0;
      fVar42 = 0.0;
      fVar28 = 0.0;
      fVar33 = 0.0;
    }
    else {
      uVar12 = 0;
      fVar41 = 0.0;
      fVar42 = 0.0;
      fVar28 = 0.0;
      fVar33 = 0.0;
      do {
        uVar48 = *(uint *)pParams->m_pPixels[uVar12].m_c;
        bVar24 = (byte)(uVar48 >> 0x18);
        auVar5[0xc] = bVar24;
        auVar5._0_12_ = ZEXT712(0);
        fVar34 = (float)(uVar48 & 0xff) - fVar39;
        fVar35 = (float)(uVar48 >> 8 & 0xff) - fVar40;
        fVar36 = (float)(int)CONCAT32(auVar5._10_3_,(ushort)(byte)(uVar48 >> 0x10)) - fVar19;
        fVar37 = (float)bVar24 - fVar25 * fVar38;
        uVar48 = (uint)(uVar12 == 0);
        uVar14 = (int)(uVar48 << 0x1f) >> 0x1f;
        uVar44 = (int)(uVar48 << 0x1f) >> 0x1f;
        uVar46 = (int)(uVar48 << 0x1f) >> 0x1f;
        uVar48 = (int)(uVar48 << 0x1f) >> 0x1f;
        fVar43 = (float)(~uVar14 & (uint)fVar41 | (uint)fVar34 & uVar14);
        fVar45 = (float)(~uVar44 & (uint)fVar42 | (uint)fVar35 & uVar44);
        fVar47 = (float)(~uVar46 & (uint)fVar28 | (uint)fVar36 & uVar46);
        fVar49 = (float)(~uVar48 & (uint)fVar33 | (uint)fVar37 & uVar48);
        fVar20 = fVar49 * fVar49 + fVar47 * fVar47 + fVar43 * fVar43 + fVar45 * fVar45;
        if ((fVar20 != 0.0) || (NAN(fVar20))) {
          if (fVar20 < 0.0) {
            fVar20 = sqrtf(fVar20);
          }
          else {
            fVar20 = SQRT(fVar20);
          }
          fVar20 = 1.0 / fVar20;
          fVar43 = fVar43 * fVar20;
          fVar45 = fVar45 * fVar20;
          fVar47 = fVar47 * fVar20;
          fVar49 = fVar49 * fVar20;
        }
        fVar41 = fVar41 + fVar49 * fVar37 * fVar34 +
                          fVar47 * fVar34 * fVar36 +
                          fVar43 * fVar34 * fVar34 + fVar45 * fVar34 * fVar35;
        fVar42 = fVar42 + fVar49 * fVar37 * fVar35 +
                          fVar47 * fVar36 * fVar35 +
                          fVar43 * fVar34 * fVar35 + fVar45 * fVar35 * fVar35;
        fVar28 = fVar28 + fVar49 * fVar37 * fVar36 +
                          fVar47 * fVar36 * fVar36 +
                          fVar43 * fVar34 * fVar36 + fVar45 * fVar36 * fVar35;
        fVar33 = fVar33 + fVar49 * fVar37 * fVar37 +
                          fVar47 * fVar37 * fVar36 +
                          fVar43 * fVar37 * fVar34 + fVar45 * fVar37 * fVar35;
        uVar12 = uVar12 + 1;
      } while (uVar12 < pParams->m_num_pixels);
    }
    fVar20 = fVar33 * fVar33 + fVar28 * fVar28 + fVar41 * fVar41 + fVar42 * fVar42;
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar20 = 1.0 / fVar20;
      fVar41 = fVar41 * fVar20;
      fVar42 = fVar42 * fVar20;
      fVar28 = fVar28 * fVar20;
      fVar33 = fVar33 * fVar20;
    }
  }
  if (fVar33 * fVar33 + fVar28 * fVar28 + fVar41 * fVar41 + fVar42 * fVar42 < 0.5) {
    bVar17 = pParams->m_perceptual == '\0';
    uVar48 = (uint)bVar17;
    uVar14 = (int)(uVar48 << 0x1f) >> 0x1f;
    uVar48 = (int)(uVar48 << 0x1f) >> 0x1f;
    fVar41 = (float)(uVar14 & 0x3f800000 | ~uVar14 & 0x3e5a1cac);
    fVar42 = (float)(uVar48 & 0x3f800000 | ~uVar48 & 0x3f370a3d);
    fVar28 = *(float *)(&DAT_001211d0 + (ulong)bVar17 * 4);
    fVar33 = 0.0;
    if (pParams->m_has_alpha != '\0') {
      fVar33 = fVar42;
    }
    fVar20 = fVar33 * fVar33 + fVar28 * fVar28 + fVar41 * fVar41 + fVar42 * fVar42;
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar20 = 1.0 / fVar20;
      fVar41 = fVar41 * fVar20;
      fVar42 = fVar42 * fVar20;
      fVar28 = fVar28 * fVar20;
      fVar33 = fVar33 * fVar20;
    }
  }
  if ((ulong)pParams->m_num_pixels == 0) {
    fVar34 = 3921568.8;
    fVar20 = -3921568.8;
  }
  else {
    pcVar3 = pParams->m_pPixels;
    fVar20 = -1e+09;
    fVar34 = 1e+09;
    uVar12 = 0;
    do {
      fVar35 = ((float)pcVar3[uVar12].m_c[3] - fVar25 * fVar38) * fVar33 +
               ((float)pcVar3[uVar12].m_c[2] - fVar19) * fVar28 +
               ((float)pcVar3[uVar12].m_c[0] - fVar39) * fVar41 +
               ((float)pcVar3[uVar12].m_c[1] - fVar40) * fVar42;
      if (fVar35 <= fVar34) {
        fVar34 = fVar35;
      }
      if (fVar20 <= fVar35) {
        fVar20 = fVar35;
      }
      uVar12 = uVar12 + 1;
    } while (pParams->m_num_pixels != uVar12);
    fVar34 = fVar34 * 0.003921569;
    fVar20 = fVar20 * 0.003921569;
  }
  fVar25 = fVar41 * fVar34 + local_114;
  fVar19 = fVar42 * fVar34 + local_110;
  uVar21 = 0;
  if ((0.0 <= fVar25) && (uVar21 = CONCAT44(fVar42,fVar25), 1.0 < fVar25)) {
    uVar21 = 0x3f800000;
  }
  fVar40 = fVar28 * fVar34 + local_118;
  fVar25 = 0.0;
  fVar39 = 0.0;
  if ((0.0 <= fVar19) && (fVar25 = fVar19, fVar39 = fVar42, 1.0 < fVar19)) {
    fVar25 = 1.0;
    fVar39 = 0.0;
  }
  fVar34 = fVar34 * fVar33 + local_10c;
  fVar19 = 0.0;
  fVar38 = 0.0;
  if ((0.0 <= fVar40) && (fVar19 = fVar40, fVar38 = fVar33, 1.0 < fVar40)) {
    fVar19 = 1.0;
    fVar38 = 0.0;
  }
  fVar41 = fVar41 * fVar20 + local_114;
  fVar40 = 0.0;
  if ((0.0 <= fVar34) && (fVar40 = fVar34, 1.0 < fVar34)) {
    fVar40 = 1.0;
  }
  fVar34 = fVar42 * fVar20 + local_110;
  uVar29 = 0;
  if ((0.0 <= fVar41) && (uVar29 = CONCAT44(fVar42,fVar41), 1.0 < fVar41)) {
    uVar29 = 0x3f800000;
  }
  fVar35 = fVar28 * fVar20 + local_118;
  fVar28 = 0.0;
  fVar41 = 0.0;
  if ((0.0 <= fVar34) && (fVar28 = fVar34, fVar41 = fVar42, 1.0 < fVar34)) {
    fVar28 = 1.0;
    fVar41 = 0.0;
  }
  fVar34 = fVar33 * fVar20 + local_10c;
  fVar20 = 0.0;
  fVar42 = 0.0;
  if ((0.0 <= fVar35) && (fVar20 = fVar35, fVar42 = fVar33, 1.0 < fVar35)) {
    fVar20 = 1.0;
    fVar42 = 0.0;
  }
  fVar35 = 0.0;
  fVar36 = 0.0;
  if ((0.0 <= fVar34) && (fVar35 = fVar34, fVar36 = fVar33, 1.0 < fVar34)) {
    fVar35 = 1.0;
    fVar36 = 0.0;
  }
  uVar26 = (undefined4)((ulong)uVar21 >> 0x20);
  uVar32 = (undefined4)((ulong)uVar29 >> 0x20);
  auVar30._0_4_ = (float)uVar29;
  fVar33 = (float)uVar21;
  if (fVar40 + fVar19 + fVar25 + fVar33 <= fVar35 + fVar20 + fVar28 + auVar30._0_4_) {
    auVar23._8_4_ = uVar26;
    auVar23._0_8_ = uVar21;
    auVar23._12_4_ = fVar39;
    auVar22._8_8_ = auVar23._8_8_;
    auVar22._4_4_ = fVar25;
    auVar22._0_4_ = fVar33;
    auVar27._4_4_ = fVar40;
    auVar27._0_4_ = fVar19;
    auVar27._8_4_ = fVar38;
    auVar27._12_4_ = 0;
    auVar31._8_4_ = uVar32;
    auVar31._0_8_ = uVar29;
    auVar31._12_4_ = fVar41;
    auVar30._8_8_ = auVar31._8_8_;
    auVar30._4_4_ = fVar28;
    uVar21 = CONCAT44(fVar35,fVar20);
  }
  else {
    auVar22._4_4_ = fVar28;
    auVar22._0_4_ = auVar30._0_4_;
    auVar30._4_4_ = fVar25;
    auVar30._0_4_ = fVar33;
    auVar27._4_4_ = fVar35;
    auVar27._0_4_ = fVar20;
    auVar27._8_4_ = fVar42;
    auVar27._12_4_ = fVar36;
    auVar22._8_4_ = uVar32;
    auVar22._12_4_ = fVar41;
    uVar21 = CONCAT44(fVar40,fVar19);
    auVar30._8_4_ = uVar26;
    auVar30._12_4_ = fVar39;
  }
  xl.m_c._0_8_ = auVar22._0_8_;
  xl.m_c._8_8_ = auVar27._0_8_;
  xh.m_c._0_8_ = auVar30._0_8_;
  xh.m_c[2] = (float)(int)uVar21;
  xh.m_c[3] = (float)(int)((ulong)uVar21 >> 0x20);
  uVar8 = find_optimal_solution(mode,xl,xh,pParams,pResults);
  if (uVar8 == 0) {
    return 0;
  }
  if (pComp_params->m_try_least_squares != '\0') {
    selectors_temp[0] = '\0';
    selectors_temp[1] = '\0';
    selectors_temp[2] = '\0';
    selectors_temp[3] = '\0';
    selectors_temp[4] = '\0';
    selectors_temp[5] = '\0';
    selectors_temp[6] = '\0';
    selectors_temp[7] = '\0';
    selectors_temp[8] = '\0';
    selectors_temp[9] = '\0';
    selectors_temp[10] = '\0';
    selectors_temp[0xb] = '\0';
    selectors_temp[0xc] = '\0';
    selectors_temp[0xd] = '\0';
    selectors_temp[0xe] = '\0';
    selectors_temp[0xf] = '\0';
    selectors_temp1[0] = '\0';
    selectors_temp1[1] = '\0';
    selectors_temp1[2] = '\0';
    selectors_temp1[3] = '\0';
    selectors_temp1[4] = '\0';
    selectors_temp1[5] = '\0';
    selectors_temp1[6] = '\0';
    selectors_temp1[7] = '\0';
    selectors_temp1[8] = '\0';
    selectors_temp1[9] = '\0';
    selectors_temp1[10] = '\0';
    selectors_temp1[0xb] = '\0';
    selectors_temp1[0xc] = '\0';
    selectors_temp1[0xd] = '\0';
    selectors_temp1[0xe] = '\0';
    selectors_temp1[0xf] = '\0';
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                 (vec4F *)selectors_temp,(vec4F *)selectors_temp1,pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                 (vec4F *)selectors_temp,(vec4F *)selectors_temp1,pParams->m_pPixels);
    }
    fVar19 = SUB84(selectors_temp._0_8_,4);
    selectors_temp._0_4_ = (float)selectors_temp._0_8_ * 0.003921569;
    selectors_temp._4_4_ = fVar19 * 0.003921569;
    fVar19 = SUB84(selectors_temp._8_8_,4);
    selectors_temp._8_4_ = (float)selectors_temp._8_8_ * 0.003921569;
    selectors_temp._12_4_ = fVar19 * 0.003921569;
    fVar19 = SUB84(selectors_temp1._0_8_,4);
    selectors_temp1._0_4_ = (float)selectors_temp1._0_8_ * 0.003921569;
    selectors_temp1._4_4_ = fVar19 * 0.003921569;
    fVar19 = SUB84(selectors_temp1._8_8_,4);
    selectors_temp1._8_4_ = (float)selectors_temp1._8_8_ * 0.003921569;
    selectors_temp1._12_4_ = fVar19 * 0.003921569;
    xl_00.m_c._8_8_ = selectors_temp._8_8_;
    xl_00.m_c._0_8_ = selectors_temp._0_8_;
    xh_00.m_c._8_8_ = selectors_temp1._8_8_;
    xh_00.m_c._0_8_ = selectors_temp1._0_8_;
    uVar8 = find_optimal_solution(mode,xl_00,xh_00,pParams,pResults);
    if (uVar8 == 0) {
      return 0;
    }
  }
  if (pComp_params->m_uber_level != 0) {
    uVar48 = pParams->m_num_pixels;
    uVar12 = (ulong)uVar48;
    memcpy(selectors_temp,pResults->m_pSelectors,uVar12);
    uVar2 = pParams->m_num_selector_weights;
    if (uVar12 == 0) {
      uVar44 = 0;
      uVar14 = 0x10;
    }
    else {
      uVar11 = 0;
      uVar14 = 0x10;
      uVar44 = 0;
      do {
        bVar24 = selectors_temp[uVar11];
        if (bVar24 <= uVar14) {
          uVar14 = (uint)bVar24;
        }
        uVar46 = (uint)bVar24;
        if (bVar24 < uVar44) {
          uVar46 = uVar44;
        }
        uVar44 = uVar46;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    uVar46 = uVar2 - 1;
    if (uVar12 != 0) {
      uVar11 = 0;
      do {
        bVar24 = selectors_temp[uVar11];
        selectors_temp1[uVar11] =
             bVar24 + ((bVar24 <= uVar46 && uVar46 != bVar24) && uVar14 == bVar24);
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    local_f8.m_c[0] = 0.0;
    local_f8.m_c[1] = 0.0;
    local_f8.m_c[2] = 0.0;
    local_f8.m_c[3] = 0.0;
    local_108.m_c[0] = 0.0;
    local_108.m_c[1] = 0.0;
    local_108.m_c[2] = 0.0;
    local_108.m_c[3] = 0.0;
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar48,selectors_temp1,pParams->m_pSelector_weightsx,&local_f8,&local_108,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar48,selectors_temp1,pParams->m_pSelector_weightsx,&local_f8,&local_108,
                 pParams->m_pPixels);
    }
    fVar19 = local_f8.m_c[1];
    local_f8.m_c[0] = local_f8.m_c[0] * 0.003921569;
    local_f8.m_c[1] = fVar19 * 0.003921569;
    fVar19 = local_f8.m_c[3];
    local_f8.m_c[2] = local_f8.m_c[2] * 0.003921569;
    local_f8.m_c[3] = fVar19 * 0.003921569;
    fVar19 = local_108.m_c[1];
    local_108.m_c[0] = local_108.m_c[0] * 0.003921569;
    local_108.m_c[1] = fVar19 * 0.003921569;
    fVar19 = local_108.m_c[3];
    local_108.m_c[2] = local_108.m_c[2] * 0.003921569;
    local_108.m_c[3] = fVar19 * 0.003921569;
    xl_01.m_c[2] = local_f8.m_c[2];
    xl_01.m_c[3] = local_f8.m_c[3];
    xl_01.m_c[0] = local_f8.m_c[0];
    xl_01.m_c[1] = local_f8.m_c[1];
    xh_01.m_c[2] = local_108.m_c[2];
    xh_01.m_c[3] = local_108.m_c[3];
    xh_01.m_c[0] = local_108.m_c[0];
    xh_01.m_c[1] = local_108.m_c[1];
    uVar8 = find_optimal_solution(mode,xl_01,xh_01,pParams,pResults);
    if (uVar8 == 0) {
LAB_00107396:
      bVar17 = false;
      unaff_RBP = 0;
    }
    else {
      uVar48 = pParams->m_num_pixels;
      if ((ulong)uVar48 != 0) {
        uVar12 = 0;
        do {
          bVar24 = selectors_temp[uVar12];
          selectors_temp1[uVar12] = bVar24 - (uVar44 == bVar24 && bVar24 != 0);
          uVar12 = uVar12 + 1;
        } while (uVar48 != uVar12);
      }
      if (pParams->m_has_alpha == '\0') {
        compute_least_squares_endpoints_rgb
                  (uVar48,selectors_temp1,pParams->m_pSelector_weightsx,&local_f8,&local_108,
                   pParams->m_pPixels);
      }
      else {
        compute_least_squares_endpoints_rgba
                  (uVar48,selectors_temp1,pParams->m_pSelector_weightsx,&local_f8,&local_108,
                   pParams->m_pPixels);
      }
      fVar19 = local_f8.m_c[1];
      local_f8.m_c[0] = local_f8.m_c[0] * 0.003921569;
      local_f8.m_c[1] = fVar19 * 0.003921569;
      fVar19 = local_f8.m_c[3];
      local_f8.m_c[2] = local_f8.m_c[2] * 0.003921569;
      local_f8.m_c[3] = fVar19 * 0.003921569;
      fVar19 = local_108.m_c[1];
      local_108.m_c[0] = local_108.m_c[0] * 0.003921569;
      local_108.m_c[1] = fVar19 * 0.003921569;
      fVar19 = local_108.m_c[3];
      local_108.m_c[2] = local_108.m_c[2] * 0.003921569;
      local_108.m_c[3] = fVar19 * 0.003921569;
      xl_02.m_c[2] = local_f8.m_c[2];
      xl_02.m_c[3] = local_f8.m_c[3];
      xl_02.m_c[0] = local_f8.m_c[0];
      xl_02.m_c[1] = local_f8.m_c[1];
      xh_02.m_c[2] = local_108.m_c[2];
      xh_02.m_c[3] = local_108.m_c[3];
      xh_02.m_c[0] = local_108.m_c[0];
      xh_02.m_c[1] = local_108.m_c[1];
      uVar8 = find_optimal_solution(mode,xl_02,xh_02,pParams,pResults);
      if (uVar8 == 0) goto LAB_00107396;
      uVar48 = pParams->m_num_pixels;
      if ((ulong)uVar48 != 0) {
        uVar12 = 0;
        do {
          bVar24 = selectors_temp[uVar12];
          uVar9 = (uint)bVar24;
          if ((uVar14 != bVar24) ||
             (uVar13 = pParams->m_num_selector_weights - 1, cVar10 = '\x01',
             uVar13 < bVar24 || uVar13 == uVar9)) {
            cVar10 = -(uVar9 != 0 && uVar44 == uVar9);
          }
          selectors_temp1[uVar12] = bVar24 + cVar10;
          uVar12 = uVar12 + 1;
        } while (uVar48 != uVar12);
      }
      if (pParams->m_has_alpha == '\0') {
        compute_least_squares_endpoints_rgb
                  (uVar48,selectors_temp1,pParams->m_pSelector_weightsx,&local_f8,&local_108,
                   pParams->m_pPixels);
      }
      else {
        compute_least_squares_endpoints_rgba
                  (uVar48,selectors_temp1,pParams->m_pSelector_weightsx,&local_f8,&local_108,
                   pParams->m_pPixels);
      }
      fVar19 = local_f8.m_c[1];
      local_f8.m_c[0] = local_f8.m_c[0] * 0.003921569;
      local_f8.m_c[1] = fVar19 * 0.003921569;
      fVar19 = local_f8.m_c[3];
      local_f8.m_c[2] = local_f8.m_c[2] * 0.003921569;
      local_f8.m_c[3] = fVar19 * 0.003921569;
      fVar19 = local_108.m_c[1];
      local_108.m_c[0] = local_108.m_c[0] * 0.003921569;
      local_108.m_c[1] = fVar19 * 0.003921569;
      fVar19 = local_108.m_c[3];
      local_108.m_c[2] = local_108.m_c[2] * 0.003921569;
      local_108.m_c[3] = fVar19 * 0.003921569;
      xl_03.m_c[2] = local_f8.m_c[2];
      xl_03.m_c[3] = local_f8.m_c[3];
      xl_03.m_c[0] = local_f8.m_c[0];
      xl_03.m_c[1] = local_f8.m_c[1];
      xh_03.m_c[2] = local_108.m_c[2];
      xh_03.m_c[3] = local_108.m_c[3];
      xh_03.m_c[0] = local_108.m_c[0];
      xh_03.m_c[1] = local_108.m_c[1];
      uVar8 = find_optimal_solution(mode,xl_03,xh_03,pParams,pResults);
      if (uVar8 == 0) {
        bVar17 = false;
        unaff_RBP = 0;
      }
      else {
        uVar48 = pComp_params->m_uber_level;
        bVar17 = true;
        if ((1 < uVar48) &&
           ((ulong)(pParams->m_num_pixels * 0x38 >> 4) < pResults->m_best_overall_err)) {
          iVar6 = 1;
          if (3 < uVar48) {
            iVar6 = uVar48 - 2;
          }
          bVar17 = iVar6 < -1;
          if (-2 < iVar6) {
            uVar44 = uVar2 - 2;
            iVar15 = iVar6 + uVar46;
            fVar19 = (float)(int)uVar46;
            uVar14 = 3;
            if (3 < uVar48) {
              uVar14 = uVar48;
            }
            iVar6 = -iVar6;
            do {
              bVar4 = iVar15 < (int)uVar44;
              if ((int)uVar44 <= iVar15) {
                uVar48 = uVar44;
                do {
                  if (uVar48 != uVar46 || iVar6 != 0) {
                    uVar9 = pParams->m_num_pixels;
                    if ((ulong)uVar9 != 0) {
                      uVar12 = 0;
                      do {
                        fVar39 = floorf((((float)selectors_temp[uVar12] - (float)iVar6) * fVar19) /
                                        ((float)(int)uVar48 - (float)iVar6) + 0.5);
                        fVar25 = 0.0;
                        if ((0.0 <= fVar39) && (fVar25 = fVar39, fVar19 < fVar39)) {
                          fVar25 = fVar19;
                        }
                        selectors_temp1[uVar12] = (uint8_t)(int)fVar25;
                        uVar12 = uVar12 + 1;
                      } while (uVar9 != uVar12);
                    }
                    local_f8.m_c[0] = 0.0;
                    local_f8.m_c[1] = 0.0;
                    local_f8.m_c[2] = 0.0;
                    local_f8.m_c[3] = 0.0;
                    local_108.m_c[0] = 0.0;
                    local_108.m_c[1] = 0.0;
                    local_108.m_c[2] = 0.0;
                    local_108.m_c[3] = 0.0;
                    if (pParams->m_has_alpha == '\0') {
                      compute_least_squares_endpoints_rgb
                                (uVar9,selectors_temp1,pParams->m_pSelector_weightsx,&local_f8,
                                 &local_108,pParams->m_pPixels);
                    }
                    else {
                      compute_least_squares_endpoints_rgba
                                (uVar9,selectors_temp1,pParams->m_pSelector_weightsx,&local_f8,
                                 &local_108,pParams->m_pPixels);
                    }
                    fVar25 = local_f8.m_c[1];
                    local_f8.m_c[0] = local_f8.m_c[0] * 0.003921569;
                    local_f8.m_c[1] = fVar25 * 0.003921569;
                    fVar25 = local_f8.m_c[3];
                    local_f8.m_c[2] = local_f8.m_c[2] * 0.003921569;
                    local_f8.m_c[3] = fVar25 * 0.003921569;
                    fVar25 = local_108.m_c[1];
                    local_108.m_c[0] = local_108.m_c[0] * 0.003921569;
                    local_108.m_c[1] = fVar25 * 0.003921569;
                    fVar25 = local_108.m_c[3];
                    local_108.m_c[2] = local_108.m_c[2] * 0.003921569;
                    local_108.m_c[3] = fVar25 * 0.003921569;
                    xl_04.m_c[2] = local_f8.m_c[2];
                    xl_04.m_c[3] = local_f8.m_c[3];
                    xl_04.m_c[0] = local_f8.m_c[0];
                    xl_04.m_c[1] = local_f8.m_c[1];
                    xh_04.m_c[2] = local_108.m_c[2];
                    xh_04.m_c[3] = local_108.m_c[3];
                    xh_04.m_c[0] = local_108.m_c[0];
                    xh_04.m_c[1] = local_108.m_c[1];
                    uVar8 = find_optimal_solution(mode,xl_04,xh_04,pParams,pResults);
                    if (uVar8 == 0) {
                      unaff_RBP = 0;
                      break;
                    }
                  }
                  bVar4 = iVar15 <= (int)uVar48;
                  bVar18 = uVar48 != (uVar2 - 3) + uVar14;
                  uVar48 = uVar48 + 1;
                } while (bVar18);
              }
              if (!bVar4) break;
              iVar7 = iVar6 + 1;
              bVar17 = 0 < iVar6;
              iVar6 = iVar7;
            } while (iVar7 != 2);
          }
        }
      }
    }
    if (!bVar17) {
      return unaff_RBP;
    }
  }
  if (mode == 1) {
    local_98 = pResults->m_pSelectors_temp;
    selectors_temp._0_8_ = pResults->m_best_overall_err;
    selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
    selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
    selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
    selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
    selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
    selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
    selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
    selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
    local_a8 = *&pResults->m_pbits;
    puStack_a0 = pResults->m_pSelectors;
    uVar12 = pack_mode1_to_one_color
                       (pParams,(color_cell_compressor_results *)selectors_temp,
                        (int)(local_114 * 255.0 + 0.5),(int)(local_110 * 255.0 + 0.5),
                        (int)(local_118 * 255.0 + 0.5),pResults->m_pSelectors_temp);
  }
  else {
    if (mode != 7) goto LAB_001074ff;
    local_98 = pResults->m_pSelectors_temp;
    selectors_temp._0_8_ = pResults->m_best_overall_err;
    selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
    selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
    selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
    selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
    selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
    selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
    selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
    selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
    local_a8 = *&pResults->m_pbits;
    puStack_a0 = pResults->m_pSelectors;
    uVar12 = pack_mode7_to_one_color
                       (pParams,(color_cell_compressor_results *)selectors_temp,
                        (int)(local_114 * 255.0 + 0.5),(int)(local_110 * 255.0 + 0.5),
                        (int)(local_118 * 255.0 + 0.5),(int)(local_10c * 255.0 + 0.5),
                        pResults->m_pSelectors_temp,pParams->m_num_pixels,pParams->m_pPixels);
  }
  if (uVar12 < pResults->m_best_overall_err) {
    *&pResults->m_pbits = local_a8;
    pResults->m_pSelectors = puStack_a0;
    pResults->m_pSelectors_temp = local_98;
    pResults->m_best_overall_err = selectors_temp._0_8_;
    (pResults->m_low_endpoint).m_c[0] = selectors_temp[8];
    (pResults->m_low_endpoint).m_c[1] = selectors_temp[9];
    (pResults->m_low_endpoint).m_c[2] = selectors_temp[10];
    (pResults->m_low_endpoint).m_c[3] = selectors_temp[0xb];
    (pResults->m_high_endpoint).m_c[0] = selectors_temp[0xc];
    (pResults->m_high_endpoint).m_c[1] = selectors_temp[0xd];
    (pResults->m_high_endpoint).m_c[2] = selectors_temp[0xe];
    (pResults->m_high_endpoint).m_c[3] = selectors_temp[0xf];
    memcpy(pResults->m_pSelectors,local_98,(ulong)pParams->m_num_pixels);
    pResults->m_best_overall_err = uVar12;
  }
LAB_001074ff:
  return pResults->m_best_overall_err;
}

Assistant:

static uint64_t color_cell_compression(uint32_t mode, const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, const bc7enc_compress_block_params *pComp_params)
{
	assert((mode == 6) || (mode == 7) || (!pParams->m_has_alpha));

	pResults->m_best_overall_err = UINT64_MAX;

	// If the partition's colors are all the same in mode 1, then just pack them as a single color.
	if (mode == 1)
	{
		const uint32_t cr = pParams->m_pPixels[0].m_c[0], cg = pParams->m_pPixels[0].m_c[1], cb = pParams->m_pPixels[0].m_c[2];

		bc7enc_bool allSame = BC7ENC_TRUE;
		for (uint32_t i = 1; i < pParams->m_num_pixels; i++)
		{
			if ((cr != pParams->m_pPixels[i].m_c[0]) || (cg != pParams->m_pPixels[i].m_c[1]) || (cb != pParams->m_pPixels[i].m_c[2]))
			{
				allSame = BC7ENC_FALSE;
				break;
			}
		}

		if (allSame)
			return pack_mode1_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
	}
	else if (mode == 7)
	{
		const uint32_t cr = pParams->m_pPixels[0].m_c[0], cg = pParams->m_pPixels[0].m_c[1], cb = pParams->m_pPixels[0].m_c[2], ca = pParams->m_pPixels[0].m_c[3];

		bc7enc_bool allSame = BC7ENC_TRUE;
		for (uint32_t i = 1; i < pParams->m_num_pixels; i++)
		{
			if ((cr != pParams->m_pPixels[i].m_c[0]) || (cg != pParams->m_pPixels[i].m_c[1]) || (cb != pParams->m_pPixels[i].m_c[2]) || (ca != pParams->m_pPixels[i].m_c[3]))
			{
				allSame = BC7ENC_FALSE;
				break;
			}
		}

		if (allSame)
			return pack_mode7_to_one_color(pParams, pResults, cr, cg, cb, ca, pResults->m_pSelectors, pParams->m_num_pixels, pParams->m_pPixels);
	}

	// Compute partition's mean color and principle axis.
	vec4F meanColor, axis;
	vec4F_set_scalar(&meanColor, 0.0f);

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
		meanColor = vec4F_add(&meanColor, &color);
	}
				
	vec4F meanColorScaled = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels));

	meanColor = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels * 255.0f));
	vec4F_saturate_in_place(&meanColor);

	if (pParams->m_has_alpha)
	{
		// Use incremental PCA for RGBA PCA, because it's simple.
		vec4F_set_scalar(&axis, 0.0f);
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
			color = vec4F_sub(&color, &meanColorScaled);
			vec4F a = vec4F_mul(&color, color.m_c[0]);
			vec4F b = vec4F_mul(&color, color.m_c[1]);
			vec4F c = vec4F_mul(&color, color.m_c[2]);
			vec4F d = vec4F_mul(&color, color.m_c[3]);
			vec4F n = i ? axis : color;
			vec4F_normalize_in_place(&n);
			axis.m_c[0] += vec4F_dot(&a, &n);
			axis.m_c[1] += vec4F_dot(&b, &n);
			axis.m_c[2] += vec4F_dot(&c, &n);
			axis.m_c[3] += vec4F_dot(&d, &n);
		}
		vec4F_normalize_in_place(&axis);
	}
	else
	{
		// Use covar technique for RGB PCA, because it doesn't require per-pixel normalization.
		float cov[6] = { 0, 0, 0, 0, 0, 0 };

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			const color_quad_u8 *pV = &pParams->m_pPixels[i];
			float r = pV->m_c[0] - meanColorScaled.m_c[0];
			float g = pV->m_c[1] - meanColorScaled.m_c[1];
			float b = pV->m_c[2] - meanColorScaled.m_c[2];
			cov[0] += r*r; cov[1] += r*g; cov[2] += r*b; cov[3] += g*g; cov[4] += g*b; cov[5] += b*b;
		}

		float vfr = .9f, vfg = 1.0f, vfb = .7f;
		for (uint32_t iter = 0; iter < 3; iter++)
		{
			float r = vfr*cov[0] + vfg*cov[1] + vfb*cov[2];
			float g = vfr*cov[1] + vfg*cov[3] + vfb*cov[4];
			float b = vfr*cov[2] + vfg*cov[4] + vfb*cov[5];

			float m = maximumf(maximumf(fabsf(r), fabsf(g)), fabsf(b));
			if (m > 1e-10f)
			{
				m = 1.0f / m;
				r *= m; g *= m;	b *= m;
			}

			vfr = r; vfg = g; vfb = b;
		}

		float len = vfr*vfr + vfg*vfg + vfb*vfb;
		if (len < 1e-10f)
			vec4F_set_scalar(&axis, 0.0f);
		else
		{
			len = 1.0f / sqrtf(len);
			vfr *= len; vfg *= len; vfb *= len;
			vec4F_set(&axis, vfr, vfg, vfb, 0);
		}
	}

	// TODO: Try picking the 2 colors with the largest projection onto the axis, instead of computing new colors along the axis.
				
	if (vec4F_dot(&axis, &axis) < .5f)
	{
		if (pParams->m_perceptual)
			vec4F_set(&axis, .213f, .715f, .072f, pParams->m_has_alpha ? .715f : 0);
		else
			vec4F_set(&axis, 1.0f, 1.0f, 1.0f, pParams->m_has_alpha ? 1.0f : 0);
		vec4F_normalize_in_place(&axis);
	}

	float l = 1e+9f, h = -1e+9f;

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);

		vec4F q = vec4F_sub(&color, &meanColorScaled);
		float d = vec4F_dot(&q, &axis);

		l = minimumf(l, d);
		h = maximumf(h, d);
	}

	l *= (1.0f / 255.0f);
	h *= (1.0f / 255.0f);

	vec4F b0 = vec4F_mul(&axis, l);
	vec4F b1 = vec4F_mul(&axis, h);
	vec4F c0 = vec4F_add(&meanColor, &b0);
	vec4F c1 = vec4F_add(&meanColor, &b1);
	vec4F minColor = vec4F_saturate(&c0);
	vec4F maxColor = vec4F_saturate(&c1);
				
	vec4F whiteVec;
	vec4F_set_scalar(&whiteVec, 1.0f);

	if (vec4F_dot(&minColor, &whiteVec) > vec4F_dot(&maxColor, &whiteVec))
	{
#if 0
		// Don't compile correctly with VC 2019 in release.
		vec4F temp = minColor;
		minColor = maxColor;
		maxColor = temp;
#else
		float a = minColor.m_c[0], b = minColor.m_c[1], c = minColor.m_c[2], d = minColor.m_c[3];
		minColor.m_c[0] = maxColor.m_c[0];
		minColor.m_c[1] = maxColor.m_c[1];
		minColor.m_c[2] = maxColor.m_c[2];
		minColor.m_c[3] = maxColor.m_c[3];
		maxColor.m_c[0] = a;
		maxColor.m_c[1] = b;
		maxColor.m_c[2] = c;
		maxColor.m_c[3] = d;
#endif
	}

	// First find a solution using the block's PCA.
	if (!find_optimal_solution(mode, minColor, maxColor, pParams, pResults))
		return 0;
	
	if (pComp_params->m_try_least_squares)
	{
		// Now try to refine the solution using least squares by computing the optimal endpoints from the current selectors.
		vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;
	}
	
	if (pComp_params->m_uber_level > 0)
	{
		// In uber level 1, try varying the selectors a little, somewhat like cluster fit would. First try incrementing the minimum selectors,
		// then try decrementing the selectrors, then try both.
		uint8_t selectors_temp[16], selectors_temp1[16];
		memcpy(selectors_temp, pResults->m_pSelectors, pParams->m_num_pixels);

		const int max_selector = pParams->m_num_selector_weights - 1;

		uint32_t min_sel = 16;
		uint32_t max_sel = 0;
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			min_sel = minimumu(min_sel, sel);
			max_sel = maximumu(max_sel, sel);
		}

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			selectors_temp1[i] = (uint8_t)sel;
		}

		vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			else if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		// In uber levels 2+, try taking more advantage of endpoint extrapolation by scaling the selectors in one direction or another.
		const uint32_t uber_err_thresh = (pParams->m_num_pixels * 56) >> 4;
		if ((pComp_params->m_uber_level >= 2) && (pResults->m_best_overall_err > uber_err_thresh))
		{
			const int Q = (pComp_params->m_uber_level >= 4) ? (pComp_params->m_uber_level - 2) : 1;
			for (int ly = -Q; ly <= 1; ly++)
			{
				for (int hy = max_selector - 1; hy <= (max_selector + Q); hy++)
				{
					if ((ly == 0) && (hy == max_selector))
						continue;

					for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
						selectors_temp1[i] = (uint8_t)clampf(floorf((float)max_selector * ((float)selectors_temp[i] - (float)ly) / ((float)hy - (float)ly) + .5f), 0, (float)max_selector);

					//vec4F xl, xh;
					vec4F_set_scalar(&xl, 0.0f);
					vec4F_set_scalar(&xh, 0.0f);
					if (pParams->m_has_alpha)
						compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
					else
						compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

					xl = vec4F_mul(&xl, (1.0f / 255.0f));
					xh = vec4F_mul(&xh, (1.0f / 255.0f));

					if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
						return 0;
				}
			}
		}
	}

	if (mode == 1)
	{
		// Try encoding the partition as a single color by using the optimal singe colors tables to encode the block to its mean.
		color_cell_compressor_results avg_results = *pResults;
		const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
		uint64_t avg_err = pack_mode1_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
		if (avg_err < pResults->m_best_overall_err)
		{
			*pResults = avg_results;
			memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
			pResults->m_best_overall_err = avg_err;
		}
	}
	else if (mode == 7)
	{
		// Try encoding the partition as a single color by using the optimal singe colors tables to encode the block to its mean.
		color_cell_compressor_results avg_results = *pResults;
		const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f), a = (int)(.5f + meanColor.m_c[3] * 255.0f);
		uint64_t avg_err = pack_mode7_to_one_color(pParams, &avg_results, r, g, b, a, pResults->m_pSelectors_temp, pParams->m_num_pixels, pParams->m_pPixels);
		if (avg_err < pResults->m_best_overall_err)
		{
			*pResults = avg_results;
			memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
			pResults->m_best_overall_err = avg_err;
		}
	}
				
	return pResults->m_best_overall_err;
}